

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::startDrag(QWidgetTextControlPrivate *this)

{
  bool bVar1;
  Int IVar2;
  QWidgetTextControl *pQVar3;
  QDrag *this_00;
  QWidget *pQVar4;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  DropAction action;
  QDrag *drag;
  QMimeData *data;
  QWidgetTextControl *q;
  DropActions actions;
  undefined4 in_stack_ffffffffffffff98;
  DropAction in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar5;
  int local_44;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_10;
  QFlagsStorage<Qt::DropAction> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  in_RDI->mousePressed = false;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x711877);
  if (bVar1) {
    (**(code **)(*(long *)pQVar3 + 0x98))();
    this_00 = (QDrag *)operator_new(0x10);
    pQVar4 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x7118b3);
    QDrag::QDrag(this_00,&pQVar4->super_QObject);
    QDrag::setMimeData((QMimeData *)this_00);
    local_c.i = 0xaaaaaaaa;
    QFlags<Qt::DropAction>::QFlags
              ((QFlags<Qt::DropAction> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    local_10.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
         (QFlagsStorage<Qt::TextInteractionFlag>)
         QFlags<Qt::TextInteractionFlag>::operator&
                   ((QFlags<Qt::TextInteractionFlag> *)
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
    if (IVar2 == 0) {
      local_44 = QDrag::exec((QFlags_conflict1 *)this_00,local_c.i);
    }
    else {
      QFlags<Qt::DropAction>::operator|=((QFlags<Qt::DropAction> *)&local_c,MoveAction);
      local_44 = QDrag::exec((QFlags_conflict1 *)this_00,local_c.i);
    }
    uVar5 = false;
    if (local_44 == 2) {
      QDrag::target();
      uVar5 = ::operator!=((QObject **)CONCAT17(uVar5,in_stack_ffffffffffffffa0),
                           (QPointer<QWidget> *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    if ((bool)uVar5 != false) {
      QTextCursor::removeSelectedText();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::startDrag()
{

#ifdef Q_OS_WASM
    // QDrag::exec() will crash without asyncify; disable drag instead.
    if (!qstdweb::haveAsyncify())
        return;
#endif

#if QT_CONFIG(draganddrop)
    Q_Q(QWidgetTextControl);
    mousePressed = false;
    if (!contextWidget)
        return;
    QMimeData *data = q->createMimeDataFromSelection();

    QDrag *drag = new QDrag(contextWidget);
    drag->setMimeData(data);

    Qt::DropActions actions = Qt::CopyAction;
    Qt::DropAction action;
    if (interactionFlags & Qt::TextEditable) {
        actions |= Qt::MoveAction;
        action = drag->exec(actions, Qt::MoveAction);
    } else {
        action = drag->exec(actions, Qt::CopyAction);
    }

    if (action == Qt::MoveAction && drag->target() != contextWidget)
        cursor.removeSelectedText();
#endif
}